

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O3

int pick_lock(obj *pick,int rx,int ry,boolean explicit,boolean loot_after)

{
  undefined1 *puVar1;
  ushort uVar2;
  level *plVar3;
  boolean bVar4;
  char cVar5;
  schar sVar6;
  char cVar7;
  char *pcVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  undefined8 extraout_RDX;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  char *pcVar15;
  monst *worm;
  int iVar16;
  undefined7 in_register_00000081;
  char *pcVar17;
  long lVar18;
  obj *obj;
  coord cc;
  schar dz;
  char qbuf [128];
  coord local_e4;
  schar local_e2;
  schar local_e1;
  int local_e0;
  int local_dc;
  long local_d8;
  char *local_d0;
  monst *local_c8;
  char *local_c0;
  char local_b8 [136];
  
  local_e2 = '\0';
  uVar2 = pick->otyp;
  uVar12 = (uint)(short)uVar2;
  if ((xlock_4 != 0) && (xlock_2 == uVar12)) {
    if (((youmonst.data)->mflags1 >> 0xd & 1) != 0) {
      pcVar8 = "key";
      if (uVar12 == 0xe3) {
        pcVar8 = "pick";
      }
      pcVar15 = "card";
      if (uVar12 != 0xe4) {
        pcVar15 = pcVar8;
      }
      pcVar8 = "stethoscope";
      if (uVar12 != 0xf2) {
        pcVar8 = pcVar15;
      }
      pcVar15 = "hold the";
LAB_001b5bfe:
      pline("Unfortunately, you can no longer %s %s.",pcVar15,pcVar8);
      picklock_dx = '\0';
      picklock_dy = '\0';
      xlock_0 = (rm *)0x0;
      xlock_1 = (obj *)0x0;
      xlock_2 = 0;
      xlock_3 = 0;
      xlock_4 = 0;
      xlock_5 = 0;
      return 0;
    }
    if ((xlock_1 != (obj *)0x0) && (bVar4 = can_reach_floor(), bVar4 == '\0')) {
      pcVar15 = "reach the";
      pcVar8 = "lock";
      goto LAB_001b5bfe;
    }
    pcVar8 = lock_action();
    pline("You resume your attempt at %s.",pcVar8);
    goto LAB_001b5b3e;
  }
  if (((youmonst.data)->mflags1 >> 0xd & 1) != 0) {
    pcVar8 = doname(pick);
    pcVar15 = "You can\'t hold %s -- you have no hands!";
    goto LAB_001b5baa;
  }
  if ((0x10 < uVar2 - 0xe2) || ((0x10007U >> (uVar2 - 0xe2 & 0x1f) & 1) == 0)) {
    warning("picking lock with object %d?",(ulong)uVar12);
    return 0;
  }
  if (ry == 0 || rx == 0) {
    iVar16 = get_adjacent_loc((char *)0x0,"Invalid location!",u.ux,u.uy,&local_e4,&local_e2);
    if (iVar16 == 0) {
      return 0;
    }
    rx = (int)(byte)local_e4.x;
    ry = (int)CONCAT71((int7)((ulong)extraout_RDX >> 8),local_e4.y);
  }
  else {
    local_e4.x = (xchar)rx;
    local_e4.y = (xchar)ry;
  }
  plVar3 = level;
  iVar16 = (int)u.uy;
  local_e1 = (char)rx - u.ux;
  if (local_e1 == '\0') {
    if (uVar2 != 0xf2 && (char)ry != u.uy) goto LAB_001b5cbd;
LAB_001b5cf1:
    if (-1 < local_e2) {
      local_c8 = (monst *)CONCAT44(local_c8._4_4_,(int)CONCAT71(in_register_00000081,loot_after));
      local_dc = ry;
      bVar4 = is_lava(level,(int)u.ux,iVar16);
      if (bVar4 != '\0') {
        pcVar8 = xname(pick);
        pcVar15 = "Doing that would probably melt your %s.";
        goto LAB_001b5baa;
      }
      local_e0 = iVar16;
      bVar4 = is_pool(level,(int)u.ux,(int)u.uy);
      if ((bVar4 == '\0') || ((u._1052_1_ & 2) != 0)) {
        obj = level->objects[local_e4.x][local_e4.y];
        if (obj != (obj *)0x0) {
          local_d0 = "unlock";
          if (uVar12 == 0xe3) {
            local_d0 = "pick";
          }
          local_c0 = "it";
          if (uVar12 == 0xe3) {
            local_c0 = "its lock";
          }
          iVar16 = 0;
          do {
            if ((ushort)(obj->otyp - 0xdaU) < 3) {
              bVar4 = can_reach_floor();
              if (bVar4 == '\0') {
                pcVar8 = xname(obj);
                pcVar8 = the(pcVar8);
                pcVar15 = "You can\'t reach %s from up here.";
                goto LAB_001b5baa;
              }
              pcVar8 = "its lock";
              pcVar15 = "fix";
              if ((*(uint *)&obj->field_0x4a >> 0xe & 1) == 0) {
                pcVar8 = "it";
                pcVar15 = "crack";
                if ((obj->otyp != 0xdc) &&
                   (pcVar8 = local_c0, pcVar15 = local_d0,
                   (*(uint *)&obj->field_0x4a >> 0xd & 1) == 0)) {
                  pcVar15 = "lock";
                  pcVar8 = "it";
                }
              }
              local_d8 = CONCAT44(local_d8._4_4_,iVar16 + 1);
              pcVar14 = doname(obj);
              pcVar17 = simple_typename((int)obj->otyp);
              pcVar17 = an(pcVar17);
              pcVar14 = safe_qbuf("",0x21,pcVar14,pcVar17,"a box");
              sprintf(local_b8,"There is %s here, %s %s?",pcVar14,pcVar15,pcVar8);
              cVar5 = yn_function(local_b8,"ynq",'q');
              if (cVar5 != 'n') {
                if (cVar5 == 'q') {
                  return 0;
                }
                if ((uVar12 != 0xf2) && (obj->otyp == 0xdc)) {
                  pcVar8 = "You aren\'t sure how to go about opening the safe that way.";
                  goto LAB_001b5cda;
                }
                uVar11 = *(uint *)&obj->field_0x4a;
                if ((uVar11 >> 0xd & 1) == 0 && obj->otyp == 0xdc) {
                  pcVar8 = "You can\'t change the combination.";
                  goto LAB_001b5cda;
                }
                if ((uVar11 >> 0xe & 1) != 0) {
                  pcVar8 = doname(pick);
                  pcVar15 = "You can\'t fix its broken lock with %s.";
                  goto LAB_001b5baa;
                }
                if ((uVar12 == 0xe4) && ((uVar11 & 0x2000) == 0)) {
                  pcVar8 = doname(pick);
                  pcVar15 = "You can\'t do that with %s.";
                  goto LAB_001b5baa;
                }
                uVar11 = uVar12 & 0xff;
                if (uVar11 < 0xe4) {
                  if (uVar11 == 0xe2) {
                    sVar6 = acurr(3);
                    iVar16 = sVar6 + 0x4b;
                  }
                  else {
                    iVar16 = 0;
                    if (uVar11 == 0xe3) {
                      sVar6 = acurr(3);
                      iVar16 = sVar6 * 4 + 0x19;
                      if (urole.malenum != 0x164) {
                        iVar16 = sVar6 * 4;
                      }
                    }
                  }
                }
                else if (uVar11 == 0xf2) {
                  sVar6 = acurr(3);
                  iVar16 = 5;
                  if (urole.malenum == 0x164) {
                    iVar16 = sVar6 * 2 + 5;
                  }
                }
                else {
                  iVar16 = 0;
                  if (uVar11 == 0xe4) {
                    sVar6 = acurr(3);
                    iVar16 = sVar6 + 0x14;
                    if (urole.malenum != 0x164) {
                      iVar16 = (int)sVar6;
                    }
                  }
                }
                iVar13 = iVar16 / 2;
                if ((obj->field_0x4a & 1) == 0) {
                  iVar13 = iVar16;
                }
                xlock_0 = (rm *)0x0;
                xlock_5 = SUB81(local_c8,0);
                cVar9 = (char)local_dc;
                cVar7 = (char)local_e0;
                iVar16 = (int)local_d8;
                xlock_1 = obj;
                xlock_2 = uVar12;
                if (cVar5 == 'y') goto LAB_001b660d;
                break;
              }
              iVar16 = (int)local_d8;
            }
            obj = (obj->v).v_nexthere;
          } while (obj != (obj *)0x0);
          if (iVar16 != 0) {
            return 0;
          }
        }
        pcVar8 = "There doesn\'t seem to be any sort of pickable lock here.";
      }
      else {
        pcVar8 = "The water has no lock.";
      }
      goto LAB_001b5cda;
    }
    if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
      pcVar8 = "there";
      if ((youmonst.data)->mlet == '\x05') {
        pcVar8 = "here";
      }
    }
    else {
      pcVar8 = "here";
    }
    pcVar15 = "There isn\'t any sort of lock up %s.";
LAB_001b5baa:
    pline(pcVar15,pcVar8);
  }
  else {
    if (uVar12 == 0xf2) goto LAB_001b5cf1;
LAB_001b5cbd:
    if ((u.utrap == 0) || (u.utraptype != 1)) {
      lVar18 = (long)(char)rx;
      pcVar8 = (char *)(long)(char)ry;
      worm = level->monsters[lVar18][(long)pcVar8];
      if ((worm != (monst *)0x0) && (uVar11 = *(uint *)&worm->field_0x60, (uVar11 >> 9 & 1) == 0)) {
        if (worm->wormno == '\0') {
          if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001b60e0;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b6025;
            local_d8 = lVar18;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b601c;
          }
          else {
LAB_001b601c:
            if (ublindf == (obj *)0x0) goto LAB_001b612e;
LAB_001b6025:
            if (ublindf->oartifact != '\x1d') goto LAB_001b612e;
          }
          if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) ||
              ((viz_array[worm->my][worm->mx] & 1U) == 0)) || ((worm->data->mflags3 & 0x200) == 0))
          goto LAB_001b612e;
        }
        else {
          local_e0 = iVar16;
          local_dc = ry;
          local_d8 = lVar18;
          local_d0 = pcVar8;
          local_c8 = worm;
          bVar4 = worm_known(level,worm);
          lVar18 = local_d8;
          pcVar8 = local_d0;
          iVar16 = local_e0;
          ry = local_dc;
          if (bVar4 == '\0') goto LAB_001b612e;
          uVar11 = *(uint *)&local_c8->field_0x60;
          worm = local_c8;
        }
LAB_001b60e0:
        if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar11 & 0x280) == 0) goto LAB_001b6116;
        }
        else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001b6116:
          if (((u._1052_1_ & 0x20) == 0) && (1 < (byte)(worm->m_ap_type - 1))) {
            if ((uVar12 == 0xe4) && (((uVar11 >> 0x19 & 1) != 0 || (worm->data == mons + 0x11e)))) {
              verbalize("No checks, no credit, no problem.");
              return 0;
            }
            pcVar8 = mon_nam(worm);
            pcVar15 = "I don\'t think %s would appreciate that.";
            goto LAB_001b5baa;
          }
        }
      }
LAB_001b612e:
      if (plVar3->locations[lVar18][(long)pcVar8].typ != '\x17') {
        iVar16 = is_drawbridge_wall((int)local_e4.x,(int)local_e4.y);
        if (iVar16 < 0) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b61e0;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b61d7;
            pcVar8 = "see";
          }
          else {
LAB_001b61d7:
            if (ublindf == (obj *)0x0) {
              pcVar8 = "feel";
            }
            else {
LAB_001b61e0:
              pcVar8 = "feel";
              if (ublindf->oartifact == '\x1d') {
                pcVar8 = "see";
              }
            }
          }
          pcVar15 = "You %s no door there.";
          goto LAB_001b5baa;
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001b61b4;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001b61ab;
          pcVar8 = "see";
        }
        else {
LAB_001b61ab:
          if (ublindf == (obj *)0x0) {
            pcVar8 = "feel";
          }
          else {
LAB_001b61b4:
            pcVar8 = "feel";
            if (ublindf->oartifact == '\x1d') {
              pcVar8 = "see";
            }
          }
        }
        pcVar15 = "You %s no lock on the drawbridge.";
        goto LAB_001b5baa;
      }
      uVar11 = *(uint *)&plVar3->locations[lVar18][(long)pcVar8].field_0x6;
      uVar10 = uVar11 >> 4 & 0x1f;
      if (uVar10 == 2) {
        pcVar8 = "You cannot lock an open door.";
      }
      else if (uVar10 == 1) {
        pcVar8 = "This door is broken.";
      }
      else if (uVar10 == 0) {
        pcVar8 = "This doorway has no door.";
      }
      else if ((uVar12 == 0xe4) && ((uVar11 & 0x80) == 0)) {
        pcVar8 = "You can\'t lock a door with a credit card.";
      }
      else {
        puVar1 = &level->locations[(int)local_e4.x][(int)local_e4.y].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 | 1;
        local_e0 = iVar16;
        local_dc = ry;
        map_background(local_e4.x,local_e4.y,1);
        pcVar15 = "Unl";
        if ((plVar3->locations[lVar18][(long)pcVar8].field_0x6 & 0x80) == 0) {
          pcVar15 = "L";
        }
        pcVar17 = "";
        pcVar14 = " with ";
        if (explicit == '\0') {
          pcVar14 = "";
        }
        else {
          pcVar17 = doname(pick);
        }
        sprintf(local_b8,"%sock it%s%s?",pcVar15,pcVar14,pcVar17);
        cVar5 = yn_function(local_b8,"yn",'n');
        if (cVar5 == 'n') {
          return 0;
        }
        if ((char)uVar2 == -0x1e) {
          sVar6 = acurr(3);
          iVar13 = sVar6 + 0x46;
        }
        else {
          if ((uVar12 & 0xff) == 0xe3) {
            sVar6 = acurr(3);
            iVar16 = sVar6 * 3;
            iVar13 = sVar6 * 3 + 0x1e;
          }
          else {
            iVar13 = 0;
            if ((uVar12 & 0xff) != 0xe4) goto LAB_001b6473;
            sVar6 = acurr(3);
            iVar16 = sVar6 * 2;
            iVar13 = sVar6 * 2 + 0x14;
          }
          if (urole.malenum != 0x164) {
            iVar13 = iVar16;
          }
        }
LAB_001b6473:
        xlock_1 = (obj *)0x0;
        xlock_5 = 0;
        xlock_0 = plVar3->locations[lVar18] + (long)pcVar8;
        bVar4 = on_level(&level->z,&dungeon_topology.d_advcal_level);
        cVar9 = (char)local_dc;
        cVar7 = (char)local_e0;
        if ((bVar4 == '\0') || (iVar13 = -1, uVar12 != 0xe2)) {
LAB_001b660d:
          picklock_dy = cVar9 - cVar7;
          flags.move = '\0';
          xlock_4 = 0;
          picklock_dx = local_e1;
          xlock_2 = uVar12;
          xlock_3 = iVar13;
          pcVar8 = lock_action();
LAB_001b5b3e:
          set_occupation(picklock,pcVar8,0);
          return 1;
        }
        pcVar8 = "Your key doesn\'t seem to fit.";
      }
    }
    else {
      pcVar8 = "You can\'t reach over the edge of the pit.";
    }
LAB_001b5cda:
    pline(pcVar8);
  }
  return 0;
}

Assistant:

int pick_lock(struct obj *pick, int rx, int ry, boolean explicit, boolean loot_after)
{
	/* rx and ry are passed only from the use-stethoscope stuff */
	int picktyp, c, ch;
	coord cc;
	struct rm	*door;
	struct obj	*otmp;
	char qbuf[QBUFSZ];
	schar dx, dy, dz = 0;

	picktyp = pick->otyp;

	/* check whether we're resuming an interrupted previous attempt */
	if (xlock.usedtime && picktyp == xlock.picktyp) {
	    static const char no_longer[] = "Unfortunately, you can no longer %s %s.";

	    if (nohands(youmonst.data)) {
		const char *what = (picktyp == LOCK_PICK) ? "pick" : "key";
		if (picktyp == CREDIT_CARD) what = "card";
		if (picktyp == STETHOSCOPE) what = "stethoscope";
		pline(no_longer, "hold the", what);
		reset_pick();
		return 0;
	    } else if (xlock.box && !can_reach_floor()) {
		pline(no_longer, "reach the", "lock");
		reset_pick();
		return 0;
	    } else {
		const char *action = lock_action();
		pline("You resume your attempt at %s.", action);
		set_occupation(picklock, action, 0);
		return 1;
	    }
	}

	if (nohands(youmonst.data)) {
		pline("You can't hold %s -- you have no hands!", doname(pick));
		return 0;
	}

	if (picktyp != LOCK_PICK &&
		picktyp != STETHOSCOPE &&
		picktyp != CREDIT_CARD &&
		picktyp != SKELETON_KEY) {
		warning("picking lock with object %d?", picktyp);
		return 0;
	}
	ch = 0;		/* lint suppression */

	/* If this is a stethoscope, we know where we came from. */
	if (rx != 0 && ry != 0) {
	    cc.x = rx;
	    cc.y = ry;
	} else {
	    if (!get_adjacent_loc(NULL, "Invalid location!", u.ux, u.uy, &cc, &dz))
		return 0;
	}

	dx = cc.x - u.ux;
	dy = cc.y - u.uy;

	/* Very clumsy special case for this, but forcing the player to
	 * a)pply > just to open a safe, when a)pply . works in all other cases? */
	if ((cc.x == u.ux && cc.y == u.uy) || picktyp == STETHOSCOPE) {	/* pick lock on a container */
	    const char *verb;
	    boolean it;
	    int count;

	    if (dz < 0) {
		pline("There isn't any sort of lock up %s.",
		      Levitation ? "here" : "there");
		return 0;
	    } else if (is_lava(level, u.ux, u.uy)) {
		pline("Doing that would probably melt your %s.",
		      xname(pick));
		return 0;
	    } else if (is_pool(level, u.ux, u.uy) && !Underwater) {
		pline("The water has no lock.");
		return 0;
	    }

	    count = 0;
	    c = 'n';			/* in case there are no boxes here */
	    for (otmp = level->objects[cc.x][cc.y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    ++count;
		    if (!can_reach_floor()) {
			pline("You can't reach %s from up here.", the(xname(otmp)));
			return 0;
		    }
		    it = 0;
		    if (otmp->obroken) verb = "fix";
		    else if (otmp->otyp == IRON_SAFE) verb = "crack", it = 1;
		    else if (!otmp->olocked) verb = "lock", it = 1;
		    else if (picktyp != LOCK_PICK) verb = "unlock", it = 1;
		    else verb = "pick";
		    sprintf(qbuf, "There is %s here, %s %s?",
			    safe_qbuf("", sizeof("There is  here, unlock its lock?"),
				      doname(otmp), an(simple_typename(otmp->otyp)), "a box"),
			    verb, it ? "it" : "its lock");

		    c = ynq(qbuf);
		    if (c == 'q') return 0;
		    if (c == 'n') continue;

		    if (otmp->otyp == IRON_SAFE && picktyp != STETHOSCOPE) {
			pline("You aren't sure how to go about opening the safe that way.");
			return 0;
		    }
		    if (!otmp->olocked && otmp->otyp == IRON_SAFE) {
			pline("You can't change the combination.");
			return 0;
		    }

		    if (otmp->obroken) {
			pline("You can't fix its broken lock with %s.", doname(pick));
			return 0;
		    }
		    else if (picktyp == CREDIT_CARD && !otmp->olocked) {
			/* credit cards are only good for unlocking */
			pline("You can't do that with %s.", doname(pick));
			return 0;
		    }
		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 4*ACURR(A_DEX) + 25*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 75 + ACURR(A_DEX);
			    break;
			case STETHOSCOPE:
			    ch = 5 + 2*ACURR(A_DEX)*Role_if(PM_ROGUE);
			    break;
			default:	ch = 0;
		    }
		    if (otmp->cursed) ch /= 2;

		    xlock.picktyp = picktyp;
		    xlock.box = otmp;
		    xlock.door = 0;
		    xlock.loot_unlocked = loot_after;
		    break;
		}
	    if (c != 'y') {
		if (!count)
		    pline("There doesn't seem to be any sort of pickable lock here.");
		return 0;		/* decided against all boxes */
	    }
	} else {			/* pick the lock in a door */
	    struct monst *mtmp;

	    if (u.utrap && u.utraptype == TT_PIT) {
		pline("You can't reach over the edge of the pit.");
		return 0;
	    }

	    door = &level->locations[cc.x][cc.y];
	    if ((mtmp = m_at(level, cc.x, cc.y)) && canseemon(level, mtmp)
			&& mtmp->m_ap_type != M_AP_FURNITURE
			&& mtmp->m_ap_type != M_AP_OBJECT) {
		if (picktyp == CREDIT_CARD &&
		    (mtmp->isshk || mtmp->data == &mons[PM_ORACLE]))
		    verbalize("No checks, no credit, no problem.");
		else
		    pline("I don't think %s would appreciate that.", mon_nam(mtmp));
		return 0;
	    }
	    if (!IS_DOOR(door->typ)) {
		if (is_drawbridge_wall(cc.x,cc.y) >= 0)
		    pline("You %s no lock on the drawbridge.",
				Blind ? "feel" : "see");
		else
		    pline("You %s no door there.",
				Blind ? "feel" : "see");
		return 0;
	    }
	    switch (door->doormask) {
		case D_NODOOR:
		    pline("This doorway has no door.");
		    return 0;
		case D_ISOPEN:
		    pline("You cannot lock an open door.");
		    return 0;
		case D_BROKEN:
		    pline("This door is broken.");
		    return 0;
		default:
		    /* credit cards are only good for unlocking */
		    if (picktyp == CREDIT_CARD && !(door->doormask & D_LOCKED)) {
			pline("You can't lock a door with a credit card.");
			return 0;
		    }

		    /*
		     * At this point, the player knows that the door
		     * is a door, and whether it's locked, but not
		     * whether it's trapped; to do this, we set the
		     * mem_door_l flag and call map_background(),
		     * which will clear it if necessary (i.e. not a door
		     * after all).
		     */
		    level->locations[cc.x][cc.y].mem_door_l = 1;
		    map_background(cc.x, cc.y, TRUE);

		    sprintf(qbuf,"%sock it%s%s?",
			(door->doormask & D_LOCKED) ? "Unl" : "L",
			explicit ? " with " : "",
			explicit ? doname(pick) : "");

		    c = yn(qbuf);
		    if (c == 'n') return 0;

		    switch(picktyp) {
			case CREDIT_CARD:
			    ch = 2*ACURR(A_DEX) + 20*Role_if (PM_ROGUE);
			    break;
			case LOCK_PICK:
			    ch = 3*ACURR(A_DEX) + 30*Role_if (PM_ROGUE);
			    break;
			case SKELETON_KEY:
			    ch = 70 + ACURR(A_DEX);
			    break;
			default:    ch = 0;
		    }
		    xlock.door = door;
		    xlock.box = 0;
		    xlock.loot_unlocked = FALSE;

		    /* ALI - Artifact doors */
		    if (artifact_door(level, cc.x, cc.y)) {
			if (picktyp == SKELETON_KEY) {
			    pline("Your key doesn't seem to fit.");
			    return 0;
			} else {
			    /* -1 == 0% chance */
			    ch = -1;
			}
		    }
	    }
	}
	flags.move = 0;
	xlock.chance = ch;
	xlock.picktyp = picktyp;
	xlock.usedtime = 0;
	picklock_dx = dx;
	picklock_dy = dy;
	set_occupation(picklock, lock_action(), 0);
	return 1;
}